

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sim.cc
# Opt level: O0

void __thiscall
kratos::DependencyVisitor::CombinationBlockVisitor::~CombinationBlockVisitor
          (CombinationBlockVisitor *this)

{
  CombinationBlockVisitor *this_local;
  
  ~CombinationBlockVisitor(this);
  operator_delete(this,0xb8);
  return;
}

Assistant:

void visit(IfStmt *stmt) override {
            auto predicate = stmt->predicate();
            auto const &[dep, linked] = DependencyVisitor::get_dep(predicate.get());
            for (auto const &var : dep) vars_.emplace(var);
            for (auto const &[var, entry] : linked) {
                linked_vars_[var].insert(entry.begin(), entry.end());
            }
        }